

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multipatchtexture.cpp
# Opt level: O1

void __thiscall
FTextureManager::AddTexturesLumps(FTextureManager *this,int lump1,int lump2,int patcheslump)

{
  int iVar1;
  int iVar2;
  FMemLump lumpdata;
  FMemLump texdir;
  FMemLump local_40;
  uint local_38;
  uint local_34;
  
  local_38 = (this->Textures).Count;
  local_34 = patcheslump;
  if (-1 < lump1) {
    FWadCollection::ReadLump((FWadCollection *)&stack0xffffffffffffffc0,0xa861c0);
    lumpdata.Block.Chars = local_40.Block.Chars;
    iVar1 = *(int *)((long)local_40.Block.Chars + -0xc);
    iVar2 = FWadCollection::LumpLength(&Wads,lump1);
    if (iVar1 == 0) {
      lumpdata.Block.Chars = (FString)(FString)(FResourceFile **)0x0;
    }
    AddTexturesLump(this,(void *)lumpdata.Block.Chars,iVar2,lump1,local_34,local_38,true);
    FMemLump::~FMemLump(&stack0xffffffffffffffc0);
  }
  if (-1 < lump2) {
    FWadCollection::ReadLump((FWadCollection *)&stack0xffffffffffffffc0,0xa861c0);
    iVar1 = *(int *)((long)local_40.Block.Chars + -0xc);
    iVar2 = FWadCollection::LumpLength(&Wads,lump2);
    if (iVar1 == 0) {
      local_40.Block.Chars = (FString)(FString)(FResourceFile **)0x0;
    }
    AddTexturesLump(this,(void *)local_40.Block.Chars,iVar2,lump2,local_34,local_38,false);
    FMemLump::~FMemLump(&stack0xffffffffffffffc0);
  }
  return;
}

Assistant:

void FTextureManager::AddTexturesLumps (int lump1, int lump2, int patcheslump)
{
	int firstdup = (int)Textures.Size();

	if (lump1 >= 0)
	{
		FMemLump texdir = Wads.ReadLump (lump1);
		AddTexturesLump (texdir.GetMem(), Wads.LumpLength (lump1), lump1, patcheslump, firstdup, true);
	}
	if (lump2 >= 0)
	{
		FMemLump texdir = Wads.ReadLump (lump2);
		AddTexturesLump (texdir.GetMem(), Wads.LumpLength (lump2), lump2, patcheslump, firstdup, false);
	}
}